

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_HashTable.h
# Opt level: O1

bool __thiscall
axl::sl::
HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
::setBucketCount(HashTable<unsigned_long,_bool,_axl::sl::HashId<unsigned_long>,_axl::sl::Eq<unsigned_long,_unsigned_long>,_unsigned_long,_const_bool_&>
                 *this,size_t bucketCount)

{
  size_t *psVar1;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  *this_00;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  *pAVar7;
  ListLink *extraout_RDX;
  ListLink *src;
  size_t sVar8;
  AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  *pAVar9;
  HashTableEntry<unsigned_long,_bool> *pHVar10;
  AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
  *pAVar11;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  newTable;
  ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  local_58;
  Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  *local_38;
  HashTableEntry<unsigned_long,_bool> *pHVar6;
  
  local_58.m_p = (AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
                  *)0x0;
  local_58.m_hdr = (Hdr *)0x0;
  local_58.m_count = 0;
  bVar3 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
          ::
          setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>::Construct>
                    ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
                      *)&local_58,bucketCount);
  if (bVar3) {
    this_00 = &this->m_table;
    bVar4 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
            ::ensureExclusive(this_00);
    if (bVar4) {
      pAVar11 = (this_00->
                super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                ).m_p;
    }
    else {
      pAVar11 = (AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
                 *)0x0;
    }
    bVar4 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
            ::ensureExclusive((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                               *)&local_58);
    pAVar9 = local_58.m_p;
    if (!bVar4) {
      pAVar9 = (AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>
                *)0x0;
    }
    sVar2 = (this->m_table).
            super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
            .m_count;
    src = extraout_RDX;
    local_38 = this_00;
    if (sVar2 != 0) {
      sVar8 = 0;
      do {
        pHVar10 = pAVar11[sVar8].
                  super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                  .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head;
        if (pHVar10 != (HashTableEntry<unsigned_long,_bool> *)0x0) {
          do {
            iVar5 = ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                    ::remove(&pAVar11[sVar8].
                              super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                             ,(char *)pHVar10);
            pHVar6 = (HashTableEntry<unsigned_long,_bool> *)CONCAT44(extraout_var,iVar5);
            pAVar7 = pAVar9 + (pHVar6->super_MapEntry<unsigned_long,_bool>).m_key % bucketCount;
            pHVar6->m_bucket = pAVar7;
            pHVar10 = (pAVar7->
                      super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                      ).super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_tail;
            src = &pHVar10->m_bucketLink;
            if (pHVar10 == (HashTableEntry<unsigned_long,_bool> *)0x0) {
              src = (ListLink *)0x0;
            }
            (pHVar6->m_bucketLink).m_next = (ListLink *)0x0;
            (pHVar6->m_bucketLink).m_prev = src;
            if (pHVar10 == (HashTableEntry<unsigned_long,_bool> *)0x0) {
              (pAVar7->
              super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
              ).super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head = pHVar6;
            }
            else {
              src->m_next = &pHVar6->m_bucketLink;
            }
            (pAVar7->
            super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
            ).super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_tail = pHVar6;
            psVar1 = &(pAVar7->
                      super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                      ).super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_count;
            *psVar1 = *psVar1 + 1;
            pHVar10 = pAVar11[sVar8].
                      super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>
                      .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head;
          } while (pHVar10 != (HashTableEntry<unsigned_long,_bool> *)0x0);
        }
        sVar8 = sVar8 + 1;
      } while (sVar8 != sVar2);
    }
    Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
    ::copy(local_38,(EVP_PKEY_CTX *)&local_58,(EVP_PKEY_CTX *)src);
  }
  ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  ::release(&local_58);
  return bVar3;
}

Assistant:

bool
	setBucketCount(size_t bucketCount) {
		Array<Bucket> newTable;
		bool result = newTable.setCount(bucketCount);
		if (!result)
			return false;

		typename Array<Bucket>::Rwi oldRwi = m_table;
		typename Array<Bucket>::Rwi newRwi = newTable;
		size_t oldBucketCount = m_table.getCount();
		for (size_t i = 0; i < oldBucketCount; i++) {
			Bucket* oldBucket = &oldRwi[i];
			while (!oldBucket->isEmpty()) {
				Entry* entry = oldBucket->removeHead();
				size_t hash = m_hash(entry->m_key);

				Bucket* newBucket = &newRwi[hash % bucketCount];
				entry->m_bucket = newBucket;
				newBucket->insertTail(entry);
			}
		}

		m_table = newTable;
		return true;
	}